

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O3

int __thiscall tcu::ThreadUtil::Thread::getMessageCount(Thread *this)

{
  pointer pMVar1;
  pointer pMVar2;
  
  deMutex_lock((this->m_messageLock).m_mutex);
  pMVar1 = (this->m_messages).
           super__Vector_base<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pMVar2 = (this->m_messages).
           super__Vector_base<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>.
           _M_impl.super__Vector_impl_data._M_start;
  deMutex_unlock((this->m_messageLock).m_mutex);
  return (int)((ulong)((long)pMVar1 - (long)pMVar2) >> 3) * -0x33333333;
}

Assistant:

int Thread::getMessageCount	 (void) const
{
	de::ScopedLock lock(m_messageLock);
	return (int)(m_messages.size());
}